

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

bool __thiscall DynamicGraph::areConnected(DynamicGraph *this,Vertex *v,Vertex *u)

{
  pointer puVar1;
  runtime_error *this_00;
  
  if (this->isInitialized != false) {
    puVar1 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    return puVar1[*v] == puVar1[*u];
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Dynamic Graph not initialized!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool DynamicGraph::areConnected(const Vertex &v, const Vertex &u)
{
    if(!this->isInitialized) {
        throw std::runtime_error("Dynamic Graph not initialized!");
    }
    return this->components[v] == this->components[u];
}